

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int analyze_miniscript_key
              (address_script_t *addr_item,uint32_t flags,miniscript_node_t *node,
              miniscript_node_t *parent_node)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  uchar local_1e8 [8];
  uchar bip32_serialized [82];
  undefined1 local_188 [8];
  ext_key extkey;
  uchar privkey_bytes [38];
  uchar local_98;
  undefined1 auStack_97 [7];
  uchar pubkey [65];
  int size;
  char *buf;
  size_t buf_len;
  size_t str_len;
  miniscript_node_t *pmStack_30;
  int ret;
  miniscript_node_t *parent_node_local;
  miniscript_node_t *node_local;
  address_script_t *paStack_18;
  uint32_t flags_local;
  address_script_t *addr_item_local;
  
  pmStack_30 = parent_node;
  parent_node_local = node;
  node_local._4_4_ = flags;
  paStack_18 = addr_item;
  buf_len = strlen(node->data);
  stack0xffffffffffffffb0 = (char *)0x0;
  if ((parent_node_local == (miniscript_node_t *)0x0) ||
     ((pmStack_30 != (miniscript_node_t *)0x0 && (pmStack_30->info == (miniscript_item_t *)0x0)))) {
    return -2;
  }
  wally_bzero(local_188,0xc0);
  if (*parent_node_local->data == '[') {
    register0x00000000 = strchr(parent_node_local->data,0x5d);
    if (register0x00000000 == (char *)0x0) {
      return -2;
    }
    iVar1 = (int)register0x00000000 - (int)parent_node_local->data;
    pubkey._60_4_ = iVar1 + 1;
    pcVar2 = (char *)wally_malloc((long)(iVar1 + 2));
    parent_node_local->key_origin_info = pcVar2;
    if (parent_node_local->key_origin_info == (char *)0x0) {
      return -3;
    }
    memcpy(parent_node_local->key_origin_info,parent_node_local->data,(long)(int)pubkey._60_4_);
    parent_node_local->key_origin_info[(int)pubkey._60_4_] = '\0';
    parent_node_local->key_origin_info_len = pubkey._60_4_;
    memmove(parent_node_local->data,stack0xffffffffffffffb0 + 1,buf_len - (long)(int)pubkey._60_4_);
    buf_len = buf_len - (long)(int)pubkey._60_4_;
    parent_node_local->data[buf_len] = '\0';
  }
  if (((node_local._4_4_ & 1) == 0) && ((buf_len == 0x42 || (buf_len == 0x82)))) {
    str_len._4_4_ = wally_hex_to_bytes(parent_node_local->data,&local_98,0x41,(size_t *)&buf);
    if (str_len._4_4_ == 0) {
      parent_node_local->kind = 0x1020;
      if (buf_len == 0x82) {
        parent_node_local->is_uncompress_key = true;
      }
      iVar1 = wally_ec_public_key_verify(&local_98,(size_t)buf);
      return iVar1;
    }
  }
  else if (((node_local._4_4_ & 1) != 0) &&
          ((buf_len == 0x40 &&
           (str_len._4_4_ =
                 wally_hex_to_bytes(parent_node_local->data,&local_98,0x41,(size_t *)&buf),
           str_len._4_4_ == 0)))) {
    parent_node_local->kind = 0x1020;
    parent_node_local->is_xonly_key = true;
    memmove(auStack_97,&local_98,(size_t)buf);
    local_98 = '\x02';
    iVar1 = wally_ec_public_key_verify(&local_98,(size_t)(buf + 1));
    return iVar1;
  }
  str_len._4_4_ =
       wally_base58_to_bytes
                 (parent_node_local->data,1,extkey.pub_key_tweak_sum + 0x18,0x26,(size_t *)&buf);
  if ((str_len._4_4_ == 0) && (buf < (char *)0x23)) {
    if ((paStack_18 != (address_script_t *)0x0) &&
       (paStack_18->version_wif != extkey.pub_key_tweak_sum[0x18])) {
      return -2;
    }
    if ((buf != (char *)0x21) && ((buf != (char *)0x22 || (privkey_bytes[0x19] != '\x01')))) {
      return -2;
    }
    parent_node_local->kind = 0x2020;
    if ((buf == (char *)0x21) &&
       (parent_node_local->is_uncompress_key = true, (node_local._4_4_ & 1) != 0)) {
      return -2;
    }
    if ((node_local._4_4_ & 1) != 0) {
      parent_node_local->is_xonly_key = true;
    }
    iVar1 = wally_ec_private_key_verify(extkey.pub_key_tweak_sum + 0x19,0x20);
    return iVar1;
  }
  register0x00000000 = strchr(parent_node_local->data,0x2f);
  if (register0x00000000 != (char *)0x0) {
    if (register0x00000000[1] == '/') {
      return -2;
    }
    pcVar2 = wally_strdup(register0x00000000);
    parent_node_local->derive_path = pcVar2;
    if (parent_node_local->derive_path == (char *)0x0) {
      return -3;
    }
    sVar3 = strlen(parent_node_local->derive_path);
    parent_node_local->derive_path_len = (uint32_t)sVar3;
    *stack0xffffffffffffffb0 = '\0';
    buf_len = strlen(parent_node_local->data);
    pcVar2 = strchr(parent_node_local->derive_path,0x2a);
    if (pcVar2 != (char *)0x0) {
      parent_node_local->is_derive = true;
    }
  }
  str_len._4_4_ = wally_base58_to_bytes(parent_node_local->data,1,local_1e8,0x52,(size_t *)&buf);
  addr_item_local._4_4_ = str_len._4_4_;
  if (str_len._4_4_ == 0) {
    if (buf < (char *)0x53) {
      str_len._4_4_ = bip32_key_unserialize(local_1e8,(size_t)buf,(ext_key *)local_188);
      addr_item_local._4_4_ = str_len._4_4_;
      if (str_len._4_4_ == 0) {
        if (extkey.pad1[2] == '\0') {
          parent_node_local->kind = 0x14020;
          if (extkey.hash160._12_4_ == 0x488ade4) {
            if (((paStack_18 != (address_script_t *)0x0) && (paStack_18->network != '\x01')) &&
               (paStack_18->network != '\x03')) {
              return -2;
            }
          }
          else if ((paStack_18 != (address_script_t *)0x0) &&
                  ((paStack_18->network == '\x01' || (paStack_18->network == '\x03')))) {
            return -2;
          }
        }
        else {
          parent_node_local->kind = 0x24020;
          if (extkey.hash160._12_4_ == 0x488b21e) {
            if (((paStack_18 != (address_script_t *)0x0) && (paStack_18->network != '\x01')) &&
               (paStack_18->network != '\x03')) {
              return -2;
            }
          }
          else if ((paStack_18 != (address_script_t *)0x0) &&
                  ((paStack_18->network == '\x01' || (paStack_18->network == '\x03')))) {
            return -2;
          }
        }
        if ((node_local._4_4_ & 1) != 0) {
          parent_node_local->is_xonly_key = true;
        }
        if ((parent_node_local->derive_path != (char *)0x0) &&
           (*parent_node_local->derive_path != '\0')) {
          str_len._4_4_ =
               convert_bip32_path_to_array
                         (parent_node_local->derive_path,(uint32_t *)0x0,0x100,
                          extkey.pad1[2] == '\0',(uint32_t *)0x0,(int8_t *)0x0);
        }
        addr_item_local._4_4_ = str_len._4_4_;
      }
    }
    else {
      addr_item_local._4_4_ = -2;
    }
  }
  return addr_item_local._4_4_;
}

Assistant:

static int analyze_miniscript_key(
    const struct address_script_t *addr_item,
    uint32_t flags,
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent_node)
{
    int ret;
    size_t str_len = strlen(node->data);
    size_t buf_len;
    char *buf = NULL;
    int size;
    unsigned char pubkey[EC_PUBLIC_KEY_UNCOMPRESSED_LEN];
    unsigned char privkey_bytes[2 + EC_PRIVATE_KEY_LEN + BASE58_CHECKSUM_LEN];
    struct ext_key extkey;

    if (!node || (parent_node && !parent_node->info))
        return WALLY_EINVAL;

    wally_bzero(&extkey, sizeof(struct ext_key));

    /*
     * key origin identification
     * https://github.com/bitcoin/bitcoin/blob/master/doc/descriptors.md#key-origin-identification
     */
    if (node->data[0] == '[') {
        buf = strchr(node->data, ']');
        if (!buf)
            return WALLY_EINVAL;

        size = (int)(buf - node->data + 1);
        node->key_origin_info = (char *) wally_malloc(size + 1);
        if (!node->key_origin_info)
            return WALLY_ENOMEM;

        memcpy(node->key_origin_info, node->data, size);
        node->key_origin_info[size] = '\0';
        node->key_origin_info_len = size;
        /* cut parent path */
        memmove(node->data, buf + 1, str_len - size);
        str_len = str_len - size;
        node->data[str_len] = '\0';
    }

    /* check key (public key) */
    if (((flags & WALLY_MINISCRIPT_TAPSCRIPT) == 0) &&
        ((str_len == EC_PUBLIC_KEY_LEN * 2) || (str_len == EC_PUBLIC_KEY_UNCOMPRESSED_LEN * 2))) {
        ret = wally_hex_to_bytes(node->data, pubkey, sizeof(pubkey), &buf_len);
        if (ret == WALLY_OK) {
            node->kind = DESCRIPTOR_KIND_PUBLIC_KEY;
            if (str_len == EC_PUBLIC_KEY_UNCOMPRESSED_LEN * 2)
                node->is_uncompress_key = true;
            return wally_ec_public_key_verify(pubkey, buf_len);
        }
    }
    else if (((flags & WALLY_MINISCRIPT_TAPSCRIPT) != 0) &&
        (str_len == XONLY_PUBLIC_KEY_LEN * 2)) {
        ret = wally_hex_to_bytes(node->data, pubkey, sizeof(pubkey), &buf_len);
        if (ret == WALLY_OK) {
            node->kind = DESCRIPTOR_KIND_PUBLIC_KEY;
            node->is_xonly_key = true;
            memmove(pubkey + 1, pubkey, buf_len);
            pubkey[0] = 2;
            return wally_ec_public_key_verify(pubkey, buf_len + 1);
        }
    }

    /* check key (private key(wif)) */
    ret = wally_base58_to_bytes(node->data, BASE58_FLAG_CHECKSUM, privkey_bytes,
                                sizeof(privkey_bytes), &buf_len);
    if ((ret == WALLY_OK) && (buf_len <= EC_PRIVATE_KEY_LEN + 2)) {
        if (addr_item && (addr_item->version_wif != privkey_bytes[0]))
            return WALLY_EINVAL;

        if ((buf_len == EC_PRIVATE_KEY_LEN + 1) ||
            ((buf_len == EC_PRIVATE_KEY_LEN + 2) && (privkey_bytes[EC_PRIVATE_KEY_LEN + 1] == 0x01))) {
            node->kind = DESCRIPTOR_KIND_PRIVATE_KEY;
            if (buf_len == EC_PRIVATE_KEY_LEN + 1) {
                node->is_uncompress_key = true;
                if ((flags & WALLY_MINISCRIPT_TAPSCRIPT) != 0)
                    return WALLY_EINVAL;
            }
            if ((flags & WALLY_MINISCRIPT_TAPSCRIPT) != 0)
                node->is_xonly_key = true;
            return wally_ec_private_key_verify(&privkey_bytes[1], EC_PRIVATE_KEY_LEN);
        }
        return WALLY_EINVAL;
    }

    /* check bip32 key */
    buf = strchr(node->data, '/');
    if (buf) {
        if (buf[1] == '/')
            return WALLY_EINVAL;

        node->derive_path = wally_strdup(buf);
        if (!node->derive_path)
            return WALLY_ENOMEM;

        node->derive_path_len = (uint32_t)strlen(node->derive_path);
        *buf = '\0';
        str_len = strlen(node->data);
        if (strchr(node->derive_path, '*') != NULL)
            node->is_derive = true;
    }

    unsigned char bip32_serialized[BIP32_SERIALIZED_LEN + BASE58_CHECKSUM_LEN];
    ret = wally_base58_to_bytes(node->data,
                                BASE58_FLAG_CHECKSUM,
                                bip32_serialized,
                                sizeof(bip32_serialized),
                                &buf_len);
    if (ret != WALLY_OK)
        return ret;
    if (buf_len > sizeof(bip32_serialized))
        return WALLY_EINVAL;

    ret = bip32_key_unserialize(bip32_serialized, buf_len, &extkey);
    if (ret != WALLY_OK)
        return ret;

    if (extkey.priv_key[0] == BIP32_FLAG_KEY_PRIVATE) {
        node->kind = DESCRIPTOR_KIND_BIP32_PRIVATE_KEY;
        if (extkey.version == BIP32_VER_MAIN_PRIVATE) {
            if (addr_item && (addr_item->network != WALLY_NETWORK_BITCOIN_MAINNET) &&
                (addr_item->network != WALLY_NETWORK_LIQUID))
                return WALLY_EINVAL;
        } else {
            if (addr_item && ((addr_item->network == WALLY_NETWORK_BITCOIN_MAINNET) ||
                              (addr_item->network == WALLY_NETWORK_LIQUID)))
                return WALLY_EINVAL;
        }
    } else {
        node->kind = DESCRIPTOR_KIND_BIP32_PUBLIC_KEY;
        if (extkey.version == BIP32_VER_MAIN_PUBLIC) {
            if (addr_item && (addr_item->network != WALLY_NETWORK_BITCOIN_MAINNET) &&
                (addr_item->network != WALLY_NETWORK_LIQUID))
                return WALLY_EINVAL;
        } else {
            if (addr_item && ((addr_item->network == WALLY_NETWORK_BITCOIN_MAINNET) ||
                              (addr_item->network == WALLY_NETWORK_LIQUID)))
                return WALLY_EINVAL;
        }
    }

    if ((flags & WALLY_MINISCRIPT_TAPSCRIPT) != 0)
        node->is_xonly_key = true;
    if (node->derive_path && node->derive_path[0] != '\0')
        ret = convert_bip32_path_to_array(node->derive_path,
                                          NULL,
                                          DESCRIPTOR_BIP32_PATH_NUM_MAX,
                                          (extkey.priv_key[0] == BIP32_FLAG_KEY_PRIVATE),
                                          NULL,
                                          NULL);
    return ret;
}